

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O2

void helicsInputSetDefaultVector
               (HelicsInput inp,double *vectorInput,int vectorLength,HelicsError *err)

{
  Input *pIVar1;
  InputObject *pIVar2;
  allocator_type local_39;
  _Vector_base<double,_std::allocator<double>_> local_38;
  
  pIVar2 = anon_unknown.dwarf_694c0::verifyInput(inp,err);
  if (pIVar2 != (InputObject *)0x0) {
    pIVar1 = pIVar2->inputPtr;
    if (vectorInput == (double *)0x0 || vectorLength < 1) {
      local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      std::vector<double,std::allocator<double>>::vector<double_const*,void>
                ((vector<double,std::allocator<double>> *)&local_38,vectorInput,
                 vectorInput + (uint)vectorLength,&local_39);
    }
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)&pIVar1->lastValue,(vector<double,_std::allocator<double>_> *)&local_38);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
  }
  return;
}

Assistant:

void helicsInputSetDefaultVector(HelicsInput inp, const double* vectorInput, int vectorLength, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return;
    }
    try {
        if ((vectorInput == nullptr) || (vectorLength <= 0)) {
            inpObj->inputPtr->setDefault(std::vector<double>{});
        } else {
            inpObj->inputPtr->setDefault(std::vector<double>(vectorInput, vectorInput + vectorLength));
        }
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}